

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_location_handler.c
# Opt level: O3

cio_http_cb_return handle_headers_complete(cio_http_client *client)

{
  cio_http_location_handler *pcVar1;
  cio_http_data_cb_t __s;
  cio_http_cb_t p_Var2;
  cio_error cVar3;
  long lVar4;
  cio_http_data_cb_t p_Var5;
  cio_http_cb_return cVar6;
  uint8_t auStack_a8 [24];
  sha1_context context;
  
  cVar6 = CIO_HTTP_CB_ERROR;
  if ((((1 < client->http_major) || ((client->http_major == 1 && (client->http_minor != 0)))) &&
      (client->http_method == CIO_HTTP_GET)) && (*(int *)&(client->parser).field_0x14 < 0)) {
    pcVar1 = client->current_handler;
    p_Var2 = pcVar1[1].on_message_complete;
    if (((ulong)p_Var2 & 4) == 0) {
      if (((ulong)p_Var2 & 8) == 0) {
        return CIO_HTTP_CB_ERROR;
      }
    }
    else {
      if (((ulong)p_Var2 & 8) == 0) {
        return CIO_HTTP_CB_ERROR;
      }
      if (*(int *)((long)&pcVar1[1].on_message_complete + 4) == -1) {
        return CIO_HTTP_CB_ERROR;
      }
    }
    if (*(char *)&pcVar1[1].on_schema != '\0') {
      sha1_reset(&context);
      pcVar1 = client->current_handler;
      sha1_input(&context,(uint8_t *)&pcVar1[1].on_schema,0x3c);
      sha1_result(&context,auStack_a8);
      cio_b64_encode_buffer(auStack_a8,0x14,(char *)&pcVar1[1].free);
      *(undefined2 *)((long)&pcVar1[2].on_host + 4) = 0xa0d;
      pcVar1[2].on_query = (cio_http_data_cb_t)"Upgrade: websocket\r\nSec-WebSocket-Accept: ";
      pcVar1[2].on_fragment = (cio_http_data_cb_t)0x2a;
      (*client->add_response_header)(client,(cio_write_buffer *)&pcVar1[2].on_port);
      pcVar1[2].on_headers_complete = (cio_http_cb_t)&pcVar1[1].free;
      pcVar1[2].on_body = (cio_http_data_cb_t)0x1e;
      (*client->add_response_header)(client,(cio_write_buffer *)&pcVar1[2].on_header_field_name);
      lVar4 = (long)*(int *)((long)&pcVar1[1].on_message_complete + 4);
      if (lVar4 != -1) {
        pcVar1[3].on_url = (cio_http_data_cb_t)"Sec-Websocket-Protocol: ";
        pcVar1[3].on_schema = (cio_http_data_cb_t)0x18;
        __s = *(cio_http_data_cb_t *)(pcVar1[1].on_headers_complete + lVar4 * 8);
        p_Var5 = (cio_http_data_cb_t)strlen((char *)__s);
        pcVar1[3].on_path = __s;
        pcVar1[3].on_query = p_Var5;
        pcVar1[3].on_header_field_value = (cio_http_data_cb_t)"\r\n";
        pcVar1[3].on_headers_complete = (cio_http_cb_t)0x2;
        (*client->add_response_header)(client,(cio_write_buffer *)&pcVar1[2].on_message_complete);
        (*client->add_response_header)(client,(cio_write_buffer *)&pcVar1[3].on_host);
        (*client->add_response_header)(client,(cio_write_buffer *)&pcVar1[3].on_fragment);
      }
      cVar3 = (*client->write_response)
                        (client,CIO_HTTP_STATUS_SWITCHING_PROTOCOLS,(cio_write_buffer *)0x0,
                         response_written);
      cVar6 = -(uint)(cVar3 != CIO_SUCCESS) | CIO_HTTP_CB_SKIP_BODY;
    }
  }
  return cVar6;
}

Assistant:

static enum cio_http_cb_return handle_headers_complete(struct cio_http_client *client)
{
	if (cio_unlikely(!check_http_version(client))) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(client->http_method != CIO_HTTP_GET)) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(!client->parser.upgrade)) {
		return CIO_HTTP_CB_ERROR;
	}

	const struct cio_websocket_location_handler *wslh = cio_const_container_of(client->current_handler, struct cio_websocket_location_handler, http_location);
	if (cio_unlikely((wslh->flags.subprotocol_requested == 1) && (wslh->chosen_subprotocol == -1))) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(wslh->flags.ws_version_ok == 0)) {
		return CIO_HTTP_CB_ERROR;
	}

	if (cio_unlikely(wslh->sec_websocket_key[0] == 0)) {
		return CIO_HTTP_CB_ERROR;
	}

	enum cio_error err = send_upgrade_response(client);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return CIO_HTTP_CB_ERROR;
	}

	return CIO_HTTP_CB_SKIP_BODY;
}